

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O2

void __thiscall
QDBusPlatformMenu::removeMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  Object *sender;
  QDBusPlatformMenu *menu;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *item;
  unsigned_long_long local_38;
  QDBusPlatformMenuItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (QDBusPlatformMenuItem *)menuItem;
  QtPrivate::sequential_erase_with_copy<QList<QDBusPlatformMenuItem*>,QDBusPlatformMenuItem*>
            ((QList<QDBusPlatformMenuItem_*> *)(this + 0x48),&local_30);
  local_38 = (**(code **)(*(long *)menuItem + 0x68))(menuItem);
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::removeImpl<unsigned_long_long>
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x40),&local_38);
  sender = (Object *)local_30->m_subMenu;
  if (sender != (Object *)0x0) {
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>),void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
              (sender,0x5979ac,(Object *)0x0,(offset_in_QDBusPlatformMenu_to_subr)this);
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(unsigned_int,int),void(QDBusPlatformMenu::*)(unsigned_int,int)>
              (sender,0x5979c8,(Object *)0x0,(offset_in_QDBusPlatformMenu_to_subr)this);
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(int,unsigned_int),void(QDBusPlatformMenu::*)(int,unsigned_int)>
              (sender,0x597a18,(Object *)0x0,(offset_in_QDBusPlatformMenu_to_subr)this);
  }
  emitUpdated(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::removeMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    m_items.removeAll(item);
    m_itemsByTag.remove(menuItem->tag());
    if (item->menu()) {
        // disconnect from the signals we connected to in syncSubMenu()
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        disconnect(menu, &QDBusPlatformMenu::propertiesUpdated,
                   this, &QDBusPlatformMenu::propertiesUpdated);
        disconnect(menu, &QDBusPlatformMenu::updated,
                   this, &QDBusPlatformMenu::updated);
        disconnect(menu, &QDBusPlatformMenu::popupRequested,
                   this, &QDBusPlatformMenu::popupRequested);
    }
    emitUpdated();
}